

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdfastpfor.h
# Opt level: O1

void __thiscall
FastPForLib::SIMDFastPFor<8U>::__decodeArray
          (SIMDFastPFor<8U> *this,uint32_t *in,size_t *length,uint32_t *out,size_t nvalue)

{
  byte *pbVar1;
  byte bVar2;
  pointer pvVar3;
  int *piVar4;
  uint32_t uVar5;
  uint32_t *in_00;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint32_t *puVar10;
  __m128i *in_01;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  const_iterator unpackpointers [33];
  undefined8 auStack_930 [255];
  undefined8 local_138 [33];
  
  puVar10 = in + (ulong)*in + 1;
  in_00 = (uint32_t *)
          ((long)in + ((ulong)puVar10[-1] + 3 & 0xfffffffffffffffc) + 8 + (ulong)*in * 4);
  uVar7 = in_00[-1];
  uVar8 = 1;
  lVar9 = 0x30;
  do {
    if ((uVar7 >> (uVar8 & 0x1f) & 1) != 0) {
      in_00 = SIMDFastPFor<8u>::
              unpackmesimd<std::vector<unsigned_int,FastPForLib::AlignedSTLAllocator<unsigned_int,64ul>>>
                        (in_00,(vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                *)((long)&(((this->datatobepacked).
                                            super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->
                                          super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                          )._M_impl.super__Vector_impl_data + lVar9),uVar8 + 1);
    }
    uVar8 = uVar8 + 1;
    lVar9 = lVar9 + 0x18;
  } while (lVar9 != 0x318);
  *length = (long)in_00 - (long)in >> 2;
  local_138[0x18] = 0;
  local_138[0x19] = 0;
  local_138[0x1a] = 0;
  local_138[0x1b] = 0;
  local_138[0x1c] = 0;
  local_138[0x1d] = 0;
  local_138[0x1e] = 0;
  local_138[0x1f] = 0;
  local_138[0x10] = 0;
  local_138[0x11] = 0;
  local_138[0x12] = 0;
  local_138[0x13] = 0;
  local_138[0x14] = 0;
  local_138[0x15] = 0;
  local_138[0x16] = 0;
  local_138[0x17] = 0;
  local_138[8] = 0;
  local_138[9] = 0;
  local_138[10] = 0;
  local_138[0xb] = 0;
  local_138[0xc] = 0;
  local_138[0xd] = 0;
  local_138[0xe] = 0;
  local_138[0xf] = 0;
  local_138[0] = 0;
  local_138[1] = 0;
  local_138[2] = 0;
  local_138[3] = 0;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_138[0x20] = 0;
  pvVar3 = (this->datatobepacked).
           super__Vector_base<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>,_std::allocator<std::vector<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar11 = vpmovsxbq_avx512f(ZEXT816(0x807060504030201));
  lVar9 = 1;
  auVar12 = vpbroadcastq_avx512f(ZEXT816(0x18));
  auVar13 = vpbroadcastq_avx512f(ZEXT816(8));
  do {
    vpmullq_avx512dq(auVar11,auVar12);
    auVar14 = vpgatherqq_avx512f(*(undefined8 *)
                                  ((long)&(pvVar3->
                                          super__Vector_base<unsigned_int,_FastPForLib::AlignedSTLAllocator<unsigned_int,_64UL>_>
                                          )._M_impl.super__Vector_impl_data + (ulong)uVar7));
    auVar14 = vmovdqu64_avx512f(auVar14);
    *(undefined1 (*) [64])(local_138 + lVar9) = auVar14;
    auVar11 = vpaddq_avx512f(auVar11,auVar13);
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0x21);
  if (0xff < nvalue) {
    in_01 = (__m128i *)(in + 1);
    uVar6 = 0;
    do {
      uVar5 = *puVar10;
      uVar7 = (uint)(byte)uVar5;
      bVar2 = *(byte *)((long)puVar10 + 1);
      uVar8 = (uint)bVar2;
      lVar9 = 0;
      do {
        SIMD_fastunpack_32(in_01,(uint32_t *)((long)out + lVar9),uVar7);
        lVar9 = lVar9 + 0x200;
        in_01 = in_01 + (byte)uVar5;
      } while ((int)lVar9 == 0x200);
      if (bVar2 == 0) {
        puVar10 = (uint32_t *)((long)puVar10 + 2);
      }
      else {
        pbVar1 = (byte *)((long)puVar10 + 2);
        puVar10 = (uint32_t *)((long)puVar10 + 3);
        lVar9 = (ulong)*pbVar1 - (ulong)uVar7;
        if ((int)lVar9 == 1) {
          do {
            uVar5 = *puVar10;
            puVar10 = (uint32_t *)((long)puVar10 + 1);
            out[(byte)uVar5] = out[(byte)uVar5] | 1 << (uVar7 & 0x1f);
            uVar8 = uVar8 - 1;
          } while (uVar8 != 0);
        }
        else {
          piVar4 = (int *)local_138[lVar9];
          do {
            uVar5 = *puVar10;
            puVar10 = (uint32_t *)((long)puVar10 + 1);
            local_138[lVar9] = piVar4 + 1;
            out[(byte)uVar5] = out[(byte)uVar5] | *piVar4 << (uVar7 & 0x1f);
            uVar8 = uVar8 - 1;
            piVar4 = piVar4 + 1;
          } while (uVar8 != 0);
        }
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      out = out + 0x100;
    } while (uVar6 < nvalue >> 8);
  }
  return;
}

Assistant:

void __decodeArray(const uint32_t *in, size_t &length, uint32_t *out,
                     const size_t nvalue) {
    const uint32_t *const initin = in;
    const uint32_t *const headerin = in++;
    const uint32_t wheremeta = headerin[0];
    const uint32_t *inexcept = headerin + wheremeta;
    const uint32_t bytesize = *inexcept++;
    const uint8_t *bytep = reinterpret_cast<const uint8_t *>(inexcept);
    inexcept += (bytesize + sizeof(uint32_t) - 1) / sizeof(uint32_t);
    const uint32_t bitmap = *(inexcept++);
    for (uint32_t k = 2; k <= 32; ++k) {
      if ((bitmap & (1U << (k - 1))) != 0) {
        inexcept = unpackmesimd(inexcept, datatobepacked[k], k);
      }
    }
    length = inexcept - initin;
    std::vector<uint32_t, cacheallocator>::const_iterator
        unpackpointers[32 + 1];
    for (uint32_t k = 1; k <= 32; ++k) {
      unpackpointers[k] = datatobepacked[k].begin();
    }
    for (uint32_t run = 0; run < nvalue / BlockSize; ++run, out += BlockSize) {
      const uint8_t b = *bytep++;
      const uint8_t cexcept = *bytep++;
      in = unpackblocksimd(in, out, b);
      if (cexcept > 0) {
        const uint8_t maxbits = *bytep++;
        if (maxbits - b == 1) {
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= static_cast<uint32_t>(1) << b;
          }
        } else {
          std::vector<uint32_t, cacheallocator>::const_iterator &exceptionsptr =
              unpackpointers[maxbits - b];
          for (uint32_t k = 0; k < cexcept; ++k) {
            const uint8_t pos = *(bytep++);
            out[pos] |= (*(exceptionsptr++)) << b;
          }
        }
      }
    }
    assert(in == headerin + wheremeta);
  }